

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::JsRTCodeParseAction_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  LoadScriptFlag LVar1;
  uint32 uVar2;
  int iVar3;
  JsRTCodeParseAction *pJVar4;
  TTDVar pvVar5;
  uint64 uVar6;
  uchar *sourceBuffer;
  
  pJVar4 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTCodeParseAction,(TTD::NSLogEvents::EventKind)67>
                     (evt);
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar5 = NSSnapValues::ParseTTDVar(false,reader);
  pJVar4->Result = pvVar5;
  uVar6 = FileReader::ReadUInt64(reader,sourceContextId,true);
  pJVar4->SourceContextId = uVar6;
  LVar1 = FileReader::ReadTag<LoadScriptFlag>(reader,loadFlag,true);
  pJVar4->LoadFlag = LVar1;
  uVar2 = FileReader::ReadUInt32(reader,bodyCounterId,true);
  pJVar4->BodyCtrId = uVar2;
  FileReader::ReadString<TTD::SlabAllocatorBase<8>>(reader,uri,alloc,&pJVar4->SourceUri,true);
  iVar3 = (*reader->_vptr_FileReader[10])(reader,10,1);
  pJVar4->IsUtf8 = SUB41(iVar3,0);
  uVar2 = FileReader::ReadLengthValue(reader,true);
  pJVar4->SourceByteLength = uVar2;
  sourceBuffer = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_char>(alloc,(ulong)uVar2);
  pJVar4->SourceCode = sourceBuffer;
  JsSupport::ReadCodeFromFile
            (threadContext,true,pJVar4->BodyCtrId,pJVar4->IsUtf8,sourceBuffer,
             pJVar4->SourceByteLength);
  return;
}

Assistant:

void JsRTCodeParseAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTCodeParseAction* cpAction = GetInlineEventDataAs<JsRTCodeParseAction, EventKind::CodeParseActionTag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            cpAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            cpAction->SourceContextId = reader->ReadUInt64(NSTokens::Key::sourceContextId, true);
            cpAction->LoadFlag = reader->ReadTag<LoadScriptFlag>(NSTokens::Key::loadFlag, true);

            cpAction->BodyCtrId = reader->ReadUInt32(NSTokens::Key::bodyCounterId, true);

            reader->ReadString(NSTokens::Key::uri, alloc, cpAction->SourceUri, true);

            cpAction->IsUtf8 = reader->ReadBool(NSTokens::Key::boolVal, true);
            cpAction->SourceByteLength = reader->ReadLengthValue(true);

            cpAction->SourceCode = alloc.SlabAllocateArray<byte>(cpAction->SourceByteLength);

            JsSupport::ReadCodeFromFile(threadContext, true, cpAction->BodyCtrId, cpAction->IsUtf8, cpAction->SourceCode, cpAction->SourceByteLength);
        }